

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O2

void __thiscall
utObjImportExport_relative_indices_Test_Test::TestBody
          (utObjImportExport_relative_indices_Test_Test *this)

{
  aiMesh *paVar1;
  char *pcVar2;
  AssertHelper local_78;
  AssertionResult gtest_ar_4;
  aiFace face;
  AssertHelper local_50;
  uint local_44;
  aiScene *scene;
  Importer myimporter;
  
  Assimp::Importer::Importer(&myimporter);
  pcVar2 = "";
  scene = Assimp::Importer::ReadFileFromMemory
                    (&myimporter,
                     "v -0.500000 0.000000 0.400000\nv -0.500000 0.000000 -0.800000\nv -0.500000 1.000000 -0.800000\nv -0.500000 1.000000 0.400000\nf -4 -3 -2 -1\nB"
                     ,0x89,0x400,"");
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&face,"nullptr","scene",(void **)&gtest_ar_4,&scene);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices != (uint *)0x0) {
      pcVar2 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x13e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  gtest_ar_4._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&face,"scene->mNumMeshes","1U",&scene->mNumMeshes,(uint *)&gtest_ar_4);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices == (uint *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  paVar1 = *scene->mMeshes;
  gtest_ar_4._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&face,"mesh->mNumVertices","4U",&paVar1->mNumVertices,(uint *)&gtest_ar_4);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices == (uint *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  gtest_ar_4._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&face,"mesh->mNumFaces","1U",&paVar1->mNumFaces,(uint *)&gtest_ar_4);
  if ((char)face.mNumIndices == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (face.mIndices == (uint *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)face.mIndices;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x143,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&face.mIndices);
  aiFace::aiFace(&face,paVar1->mFaces);
  local_78.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar_4,"face.mNumIndices","4U",&face.mNumIndices,(uint *)&local_78);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x145,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  for (local_44 = 0; local_44 < face.mNumIndices; local_44 = local_44 + 1) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar_4,"face.mIndices[i]","i",face.mIndices + local_44,&local_44);
    if (gtest_ar_4.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      pcVar2 = "";
      if (gtest_ar_4.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
                 ,0x148,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_78);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_4.message_);
  }
  aiFace::~aiFace(&face);
  Assimp::Importer::~Importer(&myimporter);
  return;
}

Assistant:

TEST_F(utObjImportExport, relative_indices_Test) {
    static const char *ObjModel =
        "v -0.500000 0.000000 0.400000\n"
        "v -0.500000 0.000000 -0.800000\n"
        "v -0.500000 1.000000 -0.800000\n"
        "v -0.500000 1.000000 0.400000\n"
        "f -4 -3 -2 -1\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(scene->mNumMeshes, 1U);
    const aiMesh *mesh = scene->mMeshes[0];
    EXPECT_EQ(mesh->mNumVertices, 4U);
    EXPECT_EQ(mesh->mNumFaces, 1U);
    const aiFace face = mesh->mFaces[0];
    EXPECT_EQ(face.mNumIndices, 4U);
    for (unsigned int i = 0; i < face.mNumIndices; ++i)
    {
        EXPECT_EQ(face.mIndices[i], i);
    }

}